

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

bool Fixpp::impl::
     doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
               (FieldRef<Fixpp::TagT<98U,_Fixpp::Type::Int>_> *message,uint tag,
               FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>_>
               *visitor)

{
  uint local_2c [2];
  int index;
  
  local_2c[0] = 0xffffffff;
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,message,visitor,(int *)local_2c);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::TagT<108U,_Fixpp::Type::Int>_> *)(message + 1),visitor,
             (int *)local_2c);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<95u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_> *)(message + 2),visitor,
             (int *)local_2c);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_> *)(message + 3),visitor,
             (int *)local_2c);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<141u,Fixpp::Type::Boolean>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_> *)(message + 4),visitor,
             (int *)local_2c);
  doVisitSingleField<5ul,Fixpp::FieldRef<Fixpp::TagT<383u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::TagT<383U,_Fixpp::Type::Int>_> *)(message + 5),visitor,
             (int *)local_2c);
  doVisitSingleField<6ul,Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  *)(message + 6),visitor,(int *)local_2c);
  doVisitSingleField<7ul,Fixpp::FieldRef<Fixpp::TagT<2154u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
            (tag,(FieldRef<Fixpp::TagT<2154U,_Fixpp::Type::Int>_> *)&message[0xca].m_view.second,
             visitor,(int *)local_2c);
  if ((long)(int)local_2c[0] != -1) {
    if (7 < local_2c[0]) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                 (long)(int)local_2c[0],8);
    }
    message[0xcc].m_view.first =
         (char *)((ulong)message[0xcc].m_view.first | 1L << ((byte)local_2c[0] & 0x3f));
  }
  return local_2c[0] != 0xffffffff;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }